

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineApplyWithArgumentsObject
          (Inline *this,Instr *callInstr,Instr *argsObjectArgInstr,FunctionJITTimeInfo *funcInfo)

{
  code *pcVar1;
  FunctionJITTimeInfo *this_00;
  bool bVar2;
  Opnd *pOVar3;
  StackSym *pSVar4;
  undefined4 *puVar5;
  BailOutInfo *bailOutInfo;
  Instr *pIVar6;
  RegOpnd *newDst;
  IntConstOpnd *newSrc;
  SymOpnd *dstOpnd;
  SymOpnd *newSrc_00;
  Opnd *src2Opnd;
  Instr *argout;
  Opnd *linkOpnd2;
  SymOpnd *linkOpnd1;
  StackSym *symDst;
  Instr *startCall;
  Instr *local_a0;
  Instr *argInsertInstr;
  Instr *instr;
  Instr *builtInStartInstr;
  ByteCodeUsesInstr *useCallTargetInstr;
  Instr *primaryBailoutInstr;
  bool safeThis;
  StackSym *pSStack_70;
  bool originalCallTargetOpndIsJITOpt;
  StackSym *originalCallTargetStackSym;
  Instr *bailOutOnNotStackArgsInsertionPoint;
  Instr *bailOutOnNotStackArgs;
  Instr *pIStack_50;
  uint argOutCount;
  Instr *argumentsObjArgOut;
  Instr *explicitThisArgOut;
  Instr *implicitThisArgOut;
  Instr *ldHeapArguments;
  Instr *instrNext;
  FunctionJITTimeInfo *funcInfo_local;
  Instr *argsObjectArgInstr_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  ldHeapArguments = callInstr->m_next;
  instrNext = (Instr *)funcInfo;
  funcInfo_local = (FunctionJITTimeInfo *)argsObjectArgInstr;
  argsObjectArgInstr_local = callInstr;
  callInstr_local = (Instr *)this;
  pOVar3 = IR::Instr::GetSrc1(argsObjectArgInstr);
  pSVar4 = IR::Opnd::GetStackSym(pOVar3);
  implicitThisArgOut = StackSym::GetInstrDef(pSVar4);
  this_00 = funcInfo_local;
  pOVar3 = IR::Instr::GetDst(implicitThisArgOut);
  IR::Instr::ReplaceSrc1((Instr *)this_00,pOVar3);
  explicitThisArgOut = (Instr *)0x0;
  argumentsObjArgOut = (Instr *)0x0;
  pIStack_50 = (Instr *)0x0;
  bailOutOnNotStackArgs._4_4_ = 0;
  GetArgInstrsForCallAndApply
            (this,argsObjectArgInstr_local,&explicitThisArgOut,&argumentsObjArgOut,
             &stack0xffffffffffffffb0,(uint *)((long)&bailOutOnNotStackArgs + 4));
  if (explicitThisArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa13,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (argumentsObjArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa14,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pIStack_50 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa15,"(argumentsObjArgOut)","argumentsObjArgOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  originalCallTargetStackSym = (StackSym *)explicitThisArgOut;
  pOVar3 = IR::Instr::GetSrc1(argsObjectArgInstr_local);
  pSStack_70 = IR::Opnd::GetStackSym(pOVar3);
  pOVar3 = IR::Instr::GetSrc1(argsObjectArgInstr_local);
  primaryBailoutInstr._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar3);
  primaryBailoutInstr._6_1_ = 0;
  bVar2 = TryOptimizeCallInstrWithFixedMethod
                    (this,argsObjectArgInstr_local,(FunctionJITTimeInfo *)instrNext,false,true,false
                     ,true,(bool *)((long)&primaryBailoutInstr + 6),false,0);
  if (bVar2) {
    if (argsObjectArgInstr_local->m_opcode != CallIFixed) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xa2a,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                         "callInstr->m_opcode == Js::OpCode::CallIFixed");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bailOutOnNotStackArgsInsertionPoint =
         &IR::BailOutInstrTemplate<IR::Instr>::New
                    (BailOnNotStackArgs,BailOutOnInlineFunction,argsObjectArgInstr_local,
                     argsObjectArgInstr_local->m_func)->super_Instr;
  }
  else {
    useCallTargetInstr =
         (ByteCodeUsesInstr *)
         PrepareInsertionPoint
                   (this,argsObjectArgInstr_local,(FunctionJITTimeInfo *)instrNext,
                    explicitThisArgOut);
    bailOutInfo = IR::Instr::GetBailOutInfo((Instr *)useCallTargetInstr);
    bailOutOnNotStackArgsInsertionPoint =
         &IR::BailOutInstrTemplate<IR::Instr>::New
                    (BailOnNotStackArgs,BailOutOnInlineFunction,bailOutInfo,
                     argsObjectArgInstr_local->m_func)->super_Instr;
    originalCallTargetStackSym = (StackSym *)useCallTargetInstr;
  }
  pIVar6 = bailOutOnNotStackArgsInsertionPoint;
  pOVar3 = IR::Instr::GetDst(implicitThisArgOut);
  pOVar3 = IR::Opnd::Copy(pOVar3,this->topFunc);
  IR::Instr::SetSrc1(pIVar6,pOVar3);
  IR::Instr::InsertBefore((Instr *)originalCallTargetStackSym,bailOutOnNotStackArgsInsertionPoint);
  if (argsObjectArgInstr_local->m_opcode == CallIFixed) {
    builtInStartInstr = &IR::ByteCodeUsesInstr::New(argsObjectArgInstr_local)->super_Instr;
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              ((ByteCodeUsesInstr *)builtInStartInstr,(bool)(primaryBailoutInstr._7_1_ & 1),
               (pSStack_70->super_Sym).m_id);
    IR::Instr::InsertBefore(argsObjectArgInstr_local,builtInStartInstr);
  }
  argInsertInstr = InsertInlineeBuiltInStartEndTags(this,argsObjectArgInstr_local,3,&instr);
  argInsertInstr->m_opcode = InlineNonTrackingBuiltInEnd;
  local_a0 = instr;
  IR::Instr::
  IterateArgInstrs<Inline::InlineApplyWithArgumentsObject(IR::Instr*,IR::Instr*,FunctionJITTimeInfo_const*)::__0>
            (instr,(anon_class_8_1_6ed359bb)&local_a0);
  pIVar6 = IR::Instr::New(StartCall,argsObjectArgInstr_local->m_func);
  newDst = IR::RegOpnd::New(TyVar,argsObjectArgInstr_local->m_func);
  IR::Instr::SetDst(pIVar6,&newDst->super_Opnd);
  newSrc = IR::IntConstOpnd::New(2,TyInt32,argsObjectArgInstr_local->m_func,false);
  IR::Instr::SetSrc1(pIVar6,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(argsObjectArgInstr_local,pIVar6);
  pSVar4 = SymTable::GetArgSlotSym(argsObjectArgInstr_local->m_func->m_symTable,2);
  dstOpnd = IR::SymOpnd::New(&pSVar4->super_Sym,0,TyVar,argsObjectArgInstr_local->m_func);
  pSVar4 = SymTable::GetArgSlotSym(argsObjectArgInstr_local->m_func->m_symTable,1);
  newSrc_00 = IR::SymOpnd::New(&pSVar4->super_Sym,0,TyVar,argsObjectArgInstr_local->m_func);
  pOVar3 = IR::Instr::GetDst(implicitThisArgOut);
  src2Opnd = IR::Instr::GetDst(pIVar6);
  pIVar6 = IR::Instr::New(ArgOut_A_FromStackArgs,&dstOpnd->super_Opnd,pOVar3,src2Opnd,
                          argsObjectArgInstr_local->m_func);
  IR::Instr::InsertBefore(argsObjectArgInstr_local,pIVar6);
  pIVar6 = argsObjectArgInstr_local;
  pOVar3 = IR::Instr::GetSrc1(explicitThisArgOut);
  IR::Instr::ReplaceSrc1(pIVar6,pOVar3);
  IR::Instr::ReplaceSrc2(argsObjectArgInstr_local,&newSrc_00->super_Opnd);
  argsObjectArgInstr_local->m_opcode = CallIDynamic;
  pOVar3 = IR::Instr::GetSrc1(argumentsObjArgOut);
  pIVar6 = IR::Instr::New(ArgOut_A_Dynamic,&newSrc_00->super_Opnd,pOVar3,&dstOpnd->super_Opnd,
                          argsObjectArgInstr_local->m_func);
  IR::Instr::InsertBefore(argsObjectArgInstr_local,pIVar6);
  return ldHeapArguments;
}

Assistant:

IR::Instr * Inline::InlineApplyWithArgumentsObject(IR::Instr * callInstr, IR::Instr * argsObjectArgInstr, const FunctionJITTimeInfo * funcInfo)
{
    IR::Instr* instrNext = callInstr->m_next;
    IR::Instr* ldHeapArguments = argsObjectArgInstr->GetSrc1()->GetStackSym()->GetInstrDef();
    argsObjectArgInstr->ReplaceSrc1(ldHeapArguments->GetDst());

    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * argumentsObjArgOut = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &argumentsObjArgOut, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);
    Assert(argumentsObjArgOut);

    //      BailOnNotEqual  s4.var                  ---------------New additional BAILOUT if not stack args or actuals exceed 16 at runtime.
    //      Bailout: #004e (BailOutOnInlineFunction)
    //      linkOpnd      Argout_FromStackArgs s4.var
    //      linkOpnd1     ArgOut_A_Dynamic  s3.var, linkOpnd
    //                    CallI_Dynamic     s6.var,  linkOpnd1

    IR::Instr* bailOutOnNotStackArgs;
    IR::Instr* bailOutOnNotStackArgsInsertionPoint = implicitThisArgOut;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    // If we optimized the call instruction for a fixed function we will have bailed out earlier if the function
    // wasn't what we expected or was not a function at all.  However, we must still check and bail out on heap arguments.
    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, funcInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis /*unused here*/))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction, callInstr, callInstr->m_func);
    }
    else
    {
        IR::Instr *primaryBailoutInstr = PrepareInsertionPoint(callInstr, funcInfo, implicitThisArgOut);
        bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction, primaryBailoutInstr->GetBailOutInfo(), callInstr->m_func);
        bailOutOnNotStackArgsInsertionPoint = primaryBailoutInstr;
    }

    // set src1 to avoid CSE on BailOnNotStackArgs for different arguments object
    bailOutOnNotStackArgs->SetSrc1(ldHeapArguments->GetDst()->Copy(this->topFunc));
    bailOutOnNotStackArgsInsertionPoint->InsertBefore(bailOutOnNotStackArgs);

    // If we optimized the call instruction for a fixed function, we must extend the function object's lifetime until after
    // the bailout on non-stack arguments.
    if (callInstr->m_opcode == Js::OpCode::CallIFixed)
    {
        IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);
        callInstr->InsertBefore(useCallTargetInstr);
    }

    // Optimize .init.apply(this, arguments);
    IR::Instr* builtInStartInstr;
    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, 3, &builtInStartInstr); //3 args (implicit this + explicit this + arguments = 3)
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    // Move argouts close to call. Globopt expects this for arguments object tracking.
    IR::Instr* argInsertInstr = builtInStartInstr;
    builtInStartInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;
        return false;
    });

    IR::Instr *startCall = IR::Instr::New(Js::OpCode::StartCall, callInstr->m_func);
    startCall->SetDst(IR::RegOpnd::New(TyVar, callInstr->m_func));
    startCall->SetSrc1(IR::IntConstOpnd::New(2, TyInt32, callInstr->m_func)); //2 args (this pointer & ArgOut_A_From_StackArgs for this direct call to init

    callInstr->InsertBefore(startCall);

    StackSym *symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(2));
    IR::SymOpnd* linkOpnd1 = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);

    symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    IR::Opnd *linkOpnd2 = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);

    // This keeps the stack args alive for bailout to recover
    IR::Instr* argout = IR::Instr::New(Js::OpCode::ArgOut_A_FromStackArgs, linkOpnd1, ldHeapArguments->GetDst(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argout);

    callInstr->ReplaceSrc1(implicitThisArgOut->GetSrc1());
    callInstr->ReplaceSrc2(linkOpnd2);
    callInstr->m_opcode = Js::OpCode::CallIDynamic;

    argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, linkOpnd2, explicitThisArgOut->GetSrc1(), linkOpnd1, callInstr->m_func); // push explicit this as this pointer
    callInstr->InsertBefore(argout);
    return instrNext;
}